

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * duckdb::StringUtil::Join
                   (string *__return_storage_ptr__,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *input,string *separator)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = *(_Rb_tree_node_base **)(input + 0x18);
  while( true ) {
    if (p_Var1 == (_Rb_tree_node_base *)(input + 8)) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var1 + 1));
    p_Var1 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var1);
    if (p_Var1 == (_Rb_tree_node_base *)(input + 8)) break;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(separator->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::Join(const set<string> &input, const string &separator) {
	// The result
	std::string result;

	auto it = input.begin();
	while (it != input.end()) {
		result += *it;
		it++;
		if (it == input.end()) {
			break;
		}
		result += separator;
	}
	return result;
}